

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O2

void __thiscall
TPZTensor<double>::Eigenvalue
          (TPZTensor<double> *this,TPZTensor<double> *eigenval,TPZTensor<double> *dSigma1,
          TPZTensor<double> *dSigma2,TPZTensor<double> *dSigma3)

{
  TPZManVector<double,_6> *copy;
  double *pdVar1;
  ostream *poVar2;
  double dVar3;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  double Lode;
  double tempCosLode;
  double tempCosPlusLode;
  double tempCosMinusLode;
  TPZTensor<double> dLodeAngleTemp;
  TPZTensor<double> dI13;
  TPZTensor<double> dLode;
  TPZTensor<double> dJ2;
  TPZTensor<double> dJ3;
  double local_250;
  double local_248;
  ulong uStack_240;
  double local_230;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  double local_200;
  double local_1f8;
  ulong uStack_1f0;
  TPZTensor<double> local_1e0;
  TPZTensor<double> local_188;
  TPZTensor<double> local_130;
  TPZTensor<double> local_d8;
  TPZTensor<double> local_80;
  
  pdVar1 = (this->fData).super_TPZVec<double>.fStore;
  local_200 = *pdVar1 + pdVar1[3] + pdVar1[5];
  dVar3 = J2(this);
  uStack_1f0 = ~(extraout_XMM0_Qb & 0x7fffffffffffffff) & extraout_XMM0_Qb;
  local_1f8 = (double)(~-(ulong)(ABS(dVar3) < 1e-06) & (ulong)dVar3 |
                      -(ulong)(ABS(dVar3) < 1e-06) & 0x3eb0c6f7a0b5ed8d);
  uStack_240 = 0;
  if (local_1f8 < 0.0) {
    local_248 = sqrt(local_1f8);
    uStack_240 = extraout_XMM0_Qb_00;
  }
  else {
    local_248 = SQRT(local_1f8);
  }
  TPZTensor(&local_d8);
  TPZTensor(&local_80);
  TPZTensor(&local_130);
  TPZTensor<double>::dJ2(this,&local_d8);
  TPZTensor<double>::dJ3(this,&local_80);
  Lodeangle(this,&local_130,&local_250);
  uStack_240 = ~(uStack_240 & 0x7fffffffffffffff) & uStack_240;
  local_248 = (double)(~-(ulong)(ABS(local_248) < 1e-06) & (ulong)(local_248 * 1.1547005383792517) |
                      -(ulong)(ABS(local_248) < 1e-06) & 0x3eb35f66ab25e8b0);
  local_230 = cos(local_250);
  local_230 = local_230 * local_248;
  local_220 = cos(local_250 + -2.0943951023931953);
  local_220 = local_220 * local_248;
  local_208 = local_220;
  local_228 = cos(local_250 + 2.0943951023931953);
  local_228 = local_228 * local_248;
  local_210 = local_228;
  if (local_250 < 0.0) {
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6363c5);
    std::endl<char,std::char_traits<char>>(poVar2);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZTensor.h"
               ,0x6ea);
  }
  if (1.0471975511965976 < local_250) {
    poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6363f3);
    std::endl<char,std::char_traits<char>>(poVar2);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZTensor.h"
               ,0x6ee);
  }
  dVar3 = local_200 / 3.0;
  pdVar1 = (eigenval->fData).super_TPZVec<double>.fStore;
  *pdVar1 = local_230 + dVar3;
  pdVar1[3] = dVar3 + local_220;
  pdVar1[5] = dVar3 + local_228;
  pdVar1[1] = pdVar1[1] * 0.0;
  pdVar1[2] = pdVar1[2] * 0.0;
  pdVar1[4] = pdVar1[4] * 0.0;
  TPZTensor(&local_188);
  *local_188.fData.super_TPZVec<double>.fStore = 1.0;
  local_188.fData.super_TPZVec<double>.fStore[5] = 1.0;
  local_188.fData.super_TPZVec<double>.fStore[3] = 1.0;
  local_188.fData.super_TPZVec<double>.fStore[4] = 0.0;
  local_188.fData.super_TPZVec<double>.fStore[1] = 0.0;
  local_188.fData.super_TPZVec<double>.fStore[2] = 0.0;
  local_1e0.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x3fd5555555555555;
  operator*=(&local_188,(double *)&local_1e0);
  local_210 = 0.5 / local_1f8;
  local_230 = local_230 * local_210;
  local_208 = local_220 * local_210;
  local_210 = local_210 * local_228;
  copy = &local_d8.fData;
  TPZManVector<double,_6>::operator=(&dSigma1->fData,copy);
  operator*=(dSigma1,&local_230);
  operator+=(dSigma1,&local_188);
  TPZTensor(&local_1e0,&local_130);
  local_218 = sin(local_250);
  local_218 = local_218 * local_248;
  operator*=(&local_1e0,&local_218);
  operator-=(dSigma1,&local_1e0);
  TPZManVector<double,_6>::operator=(&dSigma2->fData,copy);
  operator*=(dSigma2,&local_208);
  operator+=(dSigma2,&local_188);
  TPZManVector<double,_6>::operator=(&local_1e0.fData,&local_130.fData);
  local_218 = sin(2.0943951023931953 - local_250);
  local_218 = local_218 * local_248;
  operator*=(&local_1e0,&local_218);
  operator+=(dSigma2,&local_1e0);
  TPZManVector<double,_6>::operator=(&dSigma3->fData,copy);
  operator*=(dSigma3,&local_210);
  operator+=(dSigma3,&local_188);
  TPZManVector<double,_6>::operator=(&local_1e0.fData,&local_130.fData);
  local_218 = sin(local_250 + 2.0943951023931953);
  local_218 = local_248 * local_218;
  operator*=(&local_1e0,&local_218);
  operator-=(dSigma3,&local_1e0);
  ~TPZTensor(&local_1e0);
  ~TPZTensor(&local_188);
  ~TPZTensor(&local_130);
  ~TPZTensor(&local_80);
  ~TPZTensor(&local_d8);
  return;
}

Assistant:

void TPZTensor<T>::Eigenvalue(TPZTensor<T> &eigenval, TPZTensor<T> &dSigma1, TPZTensor<T> &dSigma2, TPZTensor<T> &dSigma3)const {
    T I1(this->I1()), J2(this->J2());
    //	T J3(this->J3());

    if (fabs(TPZExtractVal::val(J2)) < 1.e-6)J2 = 1.e-6;
    //	if(fabs( TPZExtractVal::val(J2) ) < 1.e-6)return;

    T sqrtJ2 = sqrt(J2);
    if (fabs(TPZExtractVal::val(sqrtJ2)) < 1.e-6)sqrtJ2 = 1.e-6;

    TPZTensor<T> dJ2, dJ3, dLode;
    T Lode;

    this->dJ2(dJ2);
    this->dJ3(dJ3);
    this->Lodeangle(dLode, Lode);

    T pi23 = T(2. * M_PI / 3.);
    T TwoOverSqrThree = T(2. / sqrt(3.));
    T TwoOverSqrThreeJ2 = TwoOverSqrThree * sqrtJ2;
    T I13 = I1 / T(3.);

    T tempCosLode = cos(Lode) * TwoOverSqrThreeJ2;
    T tempCosMinusLode = cos(Lode - pi23) * TwoOverSqrThreeJ2;
    T tempCosPlusLode = cos(Lode + pi23) * TwoOverSqrThreeJ2;

    if (TPZExtractVal::val(Lode) < 0.) {
        std::cout << "Lode angle é Menor que ZERO. Valido somente para sig1 > sig2 > sig3 -> 0 < theta < Pi/3 " << std::endl;
        DebugStop();
    }
    if (TPZExtractVal::val(Lode) > M_PI / 3.) {
        std::cout << "Lode angle é Maior que Pi/3. Valido somente para sig1 > sig2 > sig3 -> 0 < theta < Pi/3 " << std::endl;
        DebugStop();
    }

    /*ORIGINAL*/
    //Valido somente para sig1 > sig2 > sig3 -> 0 < theta < Pi/3

    eigenval.XX() = I13 + tempCosLode;
    eigenval.YY() = I13 + tempCosMinusLode;
    eigenval.ZZ() = I13 + tempCosPlusLode;
    eigenval.XY() *= T(0.);
    eigenval.XZ() *= T(0.);
    eigenval.YZ() *= T(0.);




#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "\n  TPZTENSOR";
        sout << "\n  LodeAngle = \n" << Lode;
        sout << "\n  dLodeAngle= " << dLode;
        sout << "\n";
        LOGPZ_INFO(loggerr, sout.str());
    }
#endif



    T OneOverTwoJ2 = T(0.5) / J2;
    TPZTensor<T> dI13;
    dI13.Identity();
    dI13 *= T(1. / 3.);

    tempCosLode *= OneOverTwoJ2;
    tempCosMinusLode *= OneOverTwoJ2;
    tempCosPlusLode *= OneOverTwoJ2;

    dSigma1 = dJ2;
    dSigma1 *= tempCosLode;
    dSigma1 += dI13;
    TPZTensor<T> dLodeAngleTemp(dLode);
    dLodeAngleTemp *= sin(Lode) * TwoOverSqrThreeJ2;
    dSigma1 -= dLodeAngleTemp;

    dSigma2 = dJ2;
    dSigma2 *= tempCosMinusLode;
    dSigma2 += dI13;
    dLodeAngleTemp = dLode;
    dLodeAngleTemp *= sin(pi23 - Lode) * TwoOverSqrThreeJ2;
    dSigma2 += dLodeAngleTemp;

    dSigma3 = dJ2;
    dSigma3 *= tempCosPlusLode;
    dSigma3 += dI13;
    dLodeAngleTemp = dLode;
    dLodeAngleTemp *= sin(pi23 + Lode) * TwoOverSqrThreeJ2;
    dSigma3 -= dLodeAngleTemp;
}